

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

CentralDirectoryEntry *
find_file_in_zip(BYTE *dir,char *path,uint len,uint crc,short date,short time)

{
  int iVar1;
  size_t sVar2;
  BYTE *pBStack_38;
  int flags;
  CentralDirectoryEntry *ent;
  int pathlen;
  short time_local;
  short date_local;
  uint crc_local;
  uint len_local;
  char *path_local;
  BYTE *dir_local;
  
  sVar2 = strlen(path);
  path_local = (char *)dir;
  while ((*(int *)path_local == 0x2014b50 &&
         ((pBStack_38 = (BYTE *)path_local, (uint)sVar2 != (uint)*(ushort *)(path_local + 0x1c) ||
          (iVar1 = strncmp(path_local + 0x2e,path,(long)(int)(uint)sVar2), iVar1 != 0))))) {
    path_local = path_local +
                 (ulong)*(ushort *)(path_local + 0x1c) + 0x2e +
                 (ulong)*(ushort *)(path_local + 0x1e) + (ulong)*(ushort *)(path_local + 0x20);
  }
  if (*(int *)path_local == 0x2014b50) {
    if (crc == *(uint *)(pBStack_38 + 0x10)) {
      if (len == *(uint *)(pBStack_38 + 0x18)) {
        if ((*(ushort *)(pBStack_38 + 8) & 1) == 0) {
          if (*(short *)(pBStack_38 + 0x1e) == 0) {
            dir_local = pBStack_38;
          }
          else {
            dir_local = (BYTE *)0x0;
          }
        }
        else {
          dir_local = (BYTE *)0x0;
        }
      }
      else {
        dir_local = (BYTE *)0x0;
      }
    }
    else {
      dir_local = (BYTE *)0x0;
    }
  }
  else {
    dir_local = (BYTE *)0x0;
  }
  return (CentralDirectoryEntry *)dir_local;
}

Assistant:

CentralDirectoryEntry *find_file_in_zip(BYTE *dir, const char *path, unsigned int len, unsigned int crc, short date, short time)
{
	int pathlen = (int)strlen(path);
	CentralDirectoryEntry *ent;
	int flags;

	while (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) == 0)
	{
		ent = (CentralDirectoryEntry *)dir;
		if (pathlen == LittleShort(ent->NameLength) &&
			strncmp((char *)(ent + 1), path, pathlen) == 0)
		{
			// Found something that matches by name.
			break;
		}
		dir += sizeof(*ent) + LittleShort(ent->NameLength) + LittleShort(ent->ExtraLength) + LittleShort(ent->CommentLength);
	}
	if (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) != 0)
	{
		return NULL;
	}
	if (crc != LittleLong(ent->CRC32))
	{
		return NULL;
	}
	if (len != LittleLong(ent->UncompressedSize))
	{
		return NULL;
	}
	// Should I check modification date and time here?
	flags = LittleShort(ent->Flags);
	if (flags & 1)
	{ // Don't want to deal with encryption.
		return NULL;
	}
	if (ent->ExtraLength != 0)
	{ // Don't want to deal with extra data.
		return NULL;
	}
	// Okay, looks good.
	return ent;
}